

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkheader.cpp
# Opt level: O3

void __thiscall
QHttpNetworkHeaderPrivate::setContentLength(QHttpNetworkHeaderPrivate *this,qint64 length)

{
  long in_FS_OFFSET;
  QByteArray local_58;
  QByteArray local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray(&local_40,"Content-Length",-1);
  QByteArray::number((longlong)&local_58,(int)length);
  QHttpHeaderParser::setHeaderField(&this->parser,&local_40,&local_58);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkHeaderPrivate::setContentLength(qint64 length)
{
    setHeaderField("Content-Length", QByteArray::number(length));
}